

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

void Abc_SclTransferGates(Abc_Ntk_t *pOld,Abc_Ntk_t *pNew)

{
  Abc_Obj_t *pAVar1;
  uint __line;
  int iVar2;
  Abc_Obj_t *pObj;
  int i;
  char *__assertion;
  
  if (pOld->nBarBufs2 < 1) {
    __assertion = "pOld->nBarBufs2 > 0";
    __line = 0x69;
  }
  else {
    if (pNew->nBarBufs2 == 0) {
      i = 0;
      do {
        if (pOld->vObjs->nSize <= i) {
          return;
        }
        pObj = Abc_NtkObj(pOld,i);
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
          iVar2 = Abc_ObjIsBarBuf(pObj);
          if ((iVar2 == 0) && (pAVar1 = (pObj->field_6).pCopy, pAVar1 != (Abc_Obj_t *)0x0)) {
            if (pAVar1->pNtk != pNew) {
              __assertion = "Abc_ObjNtk(pObj->pCopy) == pNew";
              __line = 0x6f;
              goto LAB_003c7a85;
            }
            pObj->field_5 = pAVar1->field_5;
          }
        }
        i = i + 1;
      } while( true );
    }
    __assertion = "pNew->nBarBufs2 == 0";
    __line = 0x6a;
  }
LAB_003c7a85:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                ,__line,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_SclTransferGates( Abc_Ntk_t * pOld, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj; int i;
    assert( pOld->nBarBufs2 > 0 );
    assert( pNew->nBarBufs2 == 0 );
    Abc_NtkForEachNodeNotBarBuf( pOld, pObj, i )
    {
        if ( pObj->pCopy == NULL )
            continue;
        assert( Abc_ObjNtk(pObj->pCopy) == pNew );
        pObj->pData = pObj->pCopy->pData;
    }
}